

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_fader_init(ma_fader_config *pConfig,ma_fader *pFader)

{
  undefined8 *in_RSI;
  int *in_RDI;
  ma_result local_14;
  
  if (in_RSI == (undefined8 *)0x0) {
    local_14 = MA_INVALID_ARGS;
  }
  else {
    if (in_RSI != (undefined8 *)0x0) {
      memset(in_RSI,0,0x28);
    }
    if (in_RDI == (int *)0x0) {
      local_14 = MA_INVALID_ARGS;
    }
    else if (*in_RDI == 5) {
      *in_RSI = *(undefined8 *)in_RDI;
      *(int *)(in_RSI + 1) = in_RDI[2];
      *(undefined4 *)((long)in_RSI + 0xc) = 0x3f800000;
      *(undefined4 *)(in_RSI + 2) = 0x3f800000;
      in_RSI[3] = 0;
      in_RSI[4] = 0;
      local_14 = MA_SUCCESS;
    }
    else {
      local_14 = MA_INVALID_ARGS;
    }
  }
  return local_14;
}

Assistant:

MA_API ma_result ma_fader_init(const ma_fader_config* pConfig, ma_fader* pFader)
{
    if (pFader == NULL) {
        return MA_INVALID_ARGS;
    }

    MA_ZERO_OBJECT(pFader);

    if (pConfig == NULL) {
        return MA_INVALID_ARGS;
    }

    /* Only f32 is supported for now. */
    if (pConfig->format != ma_format_f32) {
        return MA_INVALID_ARGS;
    }

    pFader->config         = *pConfig;
    pFader->volumeBeg      = 1;
    pFader->volumeEnd      = 1;
    pFader->lengthInFrames = 0;
    pFader->cursorInFrames = 0;

    return MA_SUCCESS;
}